

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

void __thiscall
bssl::InplaceVector<NoSelfMove,_8UL>::Shrink(InplaceVector<NoSelfMove,_8UL> *this,size_t new_size)

{
  long lVar1;
  char *this_00;
  
  lVar1 = new_size - this->size_;
  if (new_size < this->size_ || lVar1 == 0) {
    this_00 = this->storage_ + new_size * 8;
    for (; lVar1 != 0; lVar1 = lVar1 + 1) {
      std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
                ((unique_ptr<int,_std::default_delete<int>_> *)this_00);
      this_00 = this_00 + 8;
    }
    this->size_ = (PackedSize<8UL>)new_size;
    return;
  }
  abort();
}

Assistant:

void Shrink(size_t new_size) {
    BSSL_CHECK(new_size <= size_);
    std::destroy_n(data() + new_size, size_ - new_size);
    size_ = static_cast<PackedSize<N>>(new_size);
  }